

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

StackInst * __thiscall
wasm::StackIRGenerator::makeStackInst(StackIRGenerator *this,Op op,Expression *origin)

{
  StackInst *pSVar1;
  uintptr_t uVar2;
  
  pSVar1 = (StackInst *)MixedArena::allocSpace(&this->module->allocator,0x18,8);
  (pSVar1->type).id = 0;
  pSVar1->op = op;
  pSVar1->origin = origin;
  uVar2 = (origin->type).id;
  if ((((ulong)origin->_id < 0x32) && ((0x200000000000eU >> ((ulong)origin->_id & 0x3f) & 1) != 0))
     && ((uVar2 == 1 || ((TryEnd < op || ((0x10a4U >> (op & 0x1f) & 1) == 0)))))) {
    uVar2 = 0;
  }
  (pSVar1->type).id = uVar2;
  return pSVar1;
}

Assistant:

StackInst* StackIRGenerator::makeStackInst(StackInst::Op op,
                                           Expression* origin) {
  auto* ret = module.allocator.alloc<StackInst>();
  ret->op = op;
  ret->origin = origin;
  auto stackType = origin->type;
  if (origin->is<Block>() || origin->is<Loop>() || origin->is<If>() ||
      origin->is<Try>()) {
    if (stackType == Type::unreachable) {
      // There are no unreachable blocks, loops, or ifs. we emit extra
      // unreachables to fix that up, so that they are valid as having none
      // type.
      stackType = Type::none;
    } else if (op != StackInst::BlockEnd && op != StackInst::IfEnd &&
               op != StackInst::LoopEnd && op != StackInst::TryEnd) {
      // If a concrete type is returned, we mark the end of the construct has
      // having that type (as it is pushed to the value stack at that point),
      // other parts are marked as none).
      stackType = Type::none;
    }
  }
  ret->type = stackType;
  return ret;
}